

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<float>_>::SolveGMRES
          (TPZMatrix<Fad<float>_> *this,int64_t *numiterations,TPZSolver *preconditioner,
          TPZFMatrix<Fad<float>_> *H,int *numvectors,TPZFMatrix<Fad<float>_> *F,
          TPZFMatrix<Fad<float>_> *result,TPZFMatrix<Fad<float>_> *residual,REAL *tol,
          int FromCurrent)

{
  ostream *poVar1;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "virtual void TPZMatrix<Fad<float>>::SolveGMRES(int64_t &, TPZSolver &, TPZFMatrix<TVar> &, int &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, TPZFMatrix<TVar> *, REAL &, const int) [T = Fad<float>]"
                          );
  std::operator<<(poVar1," is currently not implemented ");
  std::operator<<((ostream *)&std::cerr,"for this type\nAborting...");
  pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveGMRES(int64_t &numiterations, TPZSolver &preconditioner,
                                 TPZFMatrix<TVar> &H, int &numvectors,
                                 const TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
                                 TPZFMatrix<TVar> *residual, REAL &tol,const int FromCurrent)  
{
    if constexpr(std::is_floating_point<TVar>::value){
        TPZMatrixSolver<TVar> &precond = dynamic_cast<TPZMatrixSolver<TVar> &>(preconditioner);
      if (F.Cols() > 1) {
        int64_t locnumiter = numiterations;
        TVar loctol = tol;
        int64_t nrow = F.Rows();
        int64_t ncol = F.Cols();
        int64_t col;
        // preconditioner.Solve(F, result);
        for (col = 0; col < ncol; col++) {
          //            std::cout << "Column " << col << std::endl;
          numiterations = locnumiter;
          tol = TPZExtractVal::val(loctol);
          TPZFMatrix<TVar> FCol(nrow, 1);
          F.GetSub(0, col, F.Rows(), 1, FCol);
          TPZFMatrix<TVar> resultCol(nrow, 1, &result(0, col), nrow);
          
          GMRES(*this, resultCol, FCol, precond, H, numvectors,
                numiterations, tol, residual, FromCurrent);
        }
      } else {
        GMRES(*this, result, F, precond, H, numvectors, numiterations,
              tol, residual, FromCurrent);
      }
    }else{
        PZError<<__PRETTY_FUNCTION__<<" is currently not implemented ";
        PZError<<"for this type\nAborting...";
        DebugStop();
    }
}